

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O2

void enumEitherTrie(UTrie2 *trie,UChar32 start,UChar32 limit,UTrie2EnumValue *enumValue,
                   UTrie2EnumRange *enumRange,void *context)

{
  int iVar1;
  UNewTrie2 *pUVar2;
  uint32_t *puVar3;
  UBool UVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  code *pcVar7;
  uint32_t **ppuVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  long lVar13;
  uint32_t uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint local_9c;
  uint local_98;
  uint local_88;
  uint16_t *local_70;
  
  if (enumRange == (UTrie2EnumRange *)0x0) {
    return;
  }
  pcVar7 = enumSameValue;
  if (enumValue != (UTrie2EnumValue *)0x0) {
    pcVar7 = enumValue;
  }
  pUVar2 = trie->newTrie;
  if (pUVar2 == (UNewTrie2 *)0x0) {
    local_70 = trie->index;
    ppuVar8 = &trie->data32;
    local_88 = (uint)trie->index2NullOffset;
    local_98 = (uint)trie->dataNullOffset;
  }
  else {
    ppuVar8 = &pUVar2->data;
    local_88 = pUVar2->index2NullOffset;
    local_98 = pUVar2->dataNullOffset;
    local_70 = (uint16_t *)0x0;
  }
  puVar3 = *ppuVar8;
  iVar1 = trie->highStart;
  uVar5 = (*pcVar7)(context,trie->initialValue);
  uVar11 = start;
  uVar17 = 0xffffffff;
  uVar14 = 0;
  uVar9 = 0xffffffff;
LAB_002f2210:
  do {
    local_9c = uVar11;
    uVar10 = uVar17;
LAB_002f2238:
    uVar12 = uVar14;
    uVar11 = start;
    if ((limit <= (int)uVar11) || (iVar1 <= (int)uVar11)) {
      uVar17 = local_9c;
      uVar14 = uVar12;
      if ((int)uVar11 < limit) {
        if (local_70 == (uint16_t *)0x0) {
          uVar5 = trie->newTrie->data[(long)trie->newTrie->dataLength + -4];
        }
        else if (puVar3 == (uint32_t *)0x0) {
          uVar5 = (uint32_t)local_70[trie->highValueIndex];
        }
        else {
          uVar5 = puVar3[trie->highValueIndex];
        }
        uVar5 = (*pcVar7)(context,uVar5);
        if (((uVar5 != uVar12) && (uVar17 = uVar11, uVar14 = uVar5, (int)local_9c < (int)uVar11)) &&
           (UVar4 = (*enumRange)(context,local_9c,uVar11 - 1,uVar12), UVar4 == '\0')) {
          return;
        }
      }
      (*enumRange)(context,uVar17,limit + -1,uVar14);
      return;
    }
    if ((int)uVar11 < 0x10000) {
      start = uVar11 + 0x800;
      if (limit <= (int)(uVar11 + 0x800)) {
        start = limit;
      }
      if ((uVar11 & 0xfffff800) == 0xd800) {
        uVar17 = 0x6c0;
        if ((uVar11 & 0x400) == 0) {
          uVar17 = 0x800;
        }
        start = (uVar11 & 0x400) + 0xdc00;
        goto LAB_002f22d3;
      }
      uVar17 = (int)uVar11 >> 5;
    }
    else {
      if (local_70 == (uint16_t *)0x0) {
        uVar17 = trie->newTrie->index1[uVar11 >> 0xb];
      }
      else {
        uVar17 = (uint)local_70[(ulong)(uVar11 >> 0xb) + 0x820];
      }
      start = uVar11 + 0x800;
      if ((uVar17 == uVar10) && (uVar14 = uVar12, 0x7ff < (int)(uVar11 - local_9c)))
      goto LAB_002f2238;
LAB_002f22d3:
      if (limit <= start) {
        start = limit;
      }
    }
    if (uVar17 == local_88) {
      start = uVar11 + 0x800;
      uVar14 = uVar5;
      uVar10 = local_88;
      if (uVar12 != uVar5) break;
      goto LAB_002f2238;
    }
    uVar16 = (ulong)((uint)start >> 5 & 0x3f);
    if (0x7ff < (start ^ uVar11)) {
      uVar16 = 0x40;
    }
    start = uVar11;
    for (uVar15 = (ulong)(uVar11 >> 5 & 0x3f); uVar11 = local_9c, uVar14 = uVar12, uVar15 < uVar16;
        uVar15 = uVar15 + 1) {
      if (local_70 == (uint16_t *)0x0) {
        uVar11 = trie->newTrie->index2[uVar15 + (long)(int)uVar17];
      }
      else {
        uVar11 = (uint)local_70[uVar15 + (long)(int)uVar17] << 2;
      }
      if ((uVar11 == uVar9) && (0x1f < (int)(start - local_9c))) {
        start = start + 0x20;
      }
      else if (uVar11 == local_98) {
        uVar11 = local_9c;
        if (((uVar12 != uVar5) && (uVar11 = start, (int)local_9c < start)) &&
           (UVar4 = (*enumRange)(context,local_9c,start - 1,uVar12), UVar4 == '\0')) {
          return;
        }
        start = start + 0x20;
        local_9c = uVar11;
        uVar12 = uVar5;
        uVar9 = local_98;
      }
      else {
        for (lVar13 = 0; uVar9 = uVar11, lVar13 != 0x40; lVar13 = lVar13 + 2) {
          if (puVar3 == (uint32_t *)0x0) {
            uVar14 = (uint32_t)*(ushort *)((long)local_70 + lVar13 + (long)(int)uVar11 * 2);
          }
          else {
            uVar14 = *(uint32_t *)((long)puVar3 + lVar13 * 2 + (long)(int)uVar11 * 4);
          }
          uVar6 = (*pcVar7)(context,uVar14);
          uVar9 = local_9c;
          uVar14 = uVar12;
          if (((uVar6 != uVar12) && (uVar9 = start, uVar14 = uVar6, (int)local_9c < start)) &&
             (UVar4 = (*enumRange)(context,local_9c,start - 1,uVar12), uVar9 = start, UVar4 == '\0')
             ) {
            return;
          }
          uVar12 = uVar14;
          local_9c = uVar9;
          start = start + 1;
        }
      }
    }
  } while( true );
  start = uVar11 + 0x800;
  uVar17 = local_88;
  uVar9 = local_98;
  if (((int)local_9c < (int)uVar11) &&
     (UVar4 = (*enumRange)(context,local_9c,uVar11 - 1,uVar12), UVar4 == '\0')) {
    return;
  }
  goto LAB_002f2210;
}

Assistant:

static void
enumEitherTrie(const UTrie2 *trie,
               UChar32 start, UChar32 limit,
               UTrie2EnumValue *enumValue, UTrie2EnumRange *enumRange, const void *context) {
    const uint32_t *data32;
    const uint16_t *idx;

    uint32_t value, prevValue, initialValue;
    UChar32 c, prev, highStart;
    int32_t j, i2Block, prevI2Block, index2NullOffset, block, prevBlock, nullBlock;

    if(enumRange==NULL) {
        return;
    }
    if(enumValue==NULL) {
        enumValue=enumSameValue;
    }

    if(trie->newTrie==NULL) {
        /* frozen trie */
        idx=trie->index;
        U_ASSERT(idx!=NULL); /* the following code assumes trie->newTrie is not NULL when idx is NULL */
        data32=trie->data32;

        index2NullOffset=trie->index2NullOffset;
        nullBlock=trie->dataNullOffset;
    } else {
        /* unfrozen, mutable trie */
        idx=NULL;
        data32=trie->newTrie->data;
        U_ASSERT(data32!=NULL); /* the following code assumes idx is not NULL when data32 is NULL */

        index2NullOffset=trie->newTrie->index2NullOffset;
        nullBlock=trie->newTrie->dataNullOffset;
    }

    highStart=trie->highStart;

    /* get the enumeration value that corresponds to an initial-value trie data entry */
    initialValue=enumValue(context, trie->initialValue);

    /* set variables for previous range */
    prevI2Block=-1;
    prevBlock=-1;
    prev=start;
    prevValue=0;

    /* enumerate index-2 blocks */
    for(c=start; c<limit && c<highStart;) {
        /* Code point limit for iterating inside this i2Block. */
        UChar32 tempLimit=c+UTRIE2_CP_PER_INDEX_1_ENTRY;
        if(limit<tempLimit) {
            tempLimit=limit;
        }
        if(c<=0xffff) {
            if(!U_IS_SURROGATE(c)) {
                i2Block=c>>UTRIE2_SHIFT_2;
            } else if(U_IS_SURROGATE_LEAD(c)) {
                /*
                 * Enumerate values for lead surrogate code points, not code units:
                 * This special block has half the normal length.
                 */
                i2Block=UTRIE2_LSCP_INDEX_2_OFFSET;
                tempLimit=MIN_VALUE(0xdc00, limit);
            } else {
                /*
                 * Switch back to the normal part of the index-2 table.
                 * Enumerate the second half of the surrogates block.
                 */
                i2Block=0xd800>>UTRIE2_SHIFT_2;
                tempLimit=MIN_VALUE(0xe000, limit);
            }
        } else {
            /* supplementary code points */
            if(idx!=NULL) {
                i2Block=idx[(UTRIE2_INDEX_1_OFFSET-UTRIE2_OMITTED_BMP_INDEX_1_LENGTH)+
                              (c>>UTRIE2_SHIFT_1)];
            } else {
                i2Block=trie->newTrie->index1[c>>UTRIE2_SHIFT_1];
            }
            if(i2Block==prevI2Block && (c-prev)>=UTRIE2_CP_PER_INDEX_1_ENTRY) {
                /*
                 * The index-2 block is the same as the previous one, and filled with prevValue.
                 * Only possible for supplementary code points because the linear-BMP index-2
                 * table creates unique i2Block values.
                 */
                c+=UTRIE2_CP_PER_INDEX_1_ENTRY;
                continue;
            }
        }
        prevI2Block=i2Block;
        if(i2Block==index2NullOffset) {
            /* this is the null index-2 block */
            if(prevValue!=initialValue) {
                if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                    return;
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }
            c+=UTRIE2_CP_PER_INDEX_1_ENTRY;
        } else {
            /* enumerate data blocks for one index-2 block */
            int32_t i2, i2Limit;
            i2=(c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
            if((c>>UTRIE2_SHIFT_1)==(tempLimit>>UTRIE2_SHIFT_1)) {
                i2Limit=(tempLimit>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
            } else {
                i2Limit=UTRIE2_INDEX_2_BLOCK_LENGTH;
            }
            for(; i2<i2Limit; ++i2) {
                if(idx!=NULL) {
                    block=(int32_t)idx[i2Block+i2]<<UTRIE2_INDEX_SHIFT;
                } else {
                    block=trie->newTrie->index2[i2Block+i2];
                }
                if(block==prevBlock && (c-prev)>=UTRIE2_DATA_BLOCK_LENGTH) {
                    /* the block is the same as the previous one, and filled with prevValue */
                    c+=UTRIE2_DATA_BLOCK_LENGTH;
                    continue;
                }
                prevBlock=block;
                if(block==nullBlock) {
                    /* this is the null data block */
                    if(prevValue!=initialValue) {
                        if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                            return;
                        }
                        prev=c;
                        prevValue=initialValue;
                    }
                    c+=UTRIE2_DATA_BLOCK_LENGTH;
                } else {
                    for(j=0; j<UTRIE2_DATA_BLOCK_LENGTH; ++j) {
                        value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                        if(value!=prevValue) {
                            if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                                return;
                            }
                            prev=c;
                            prevValue=value;
                        }
                        ++c;
                    }
                }
            }
        }
    }

    if(c>limit) {
        c=limit;  /* could be higher if in the index2NullOffset */
    } else if(c<limit) {
        /* c==highStart<limit */
        uint32_t highValue;
        if(idx!=NULL) {
            highValue=
                data32!=NULL ?
                    data32[trie->highValueIndex] :
                    idx[trie->highValueIndex];
        } else {
            highValue=trie->newTrie->data[trie->newTrie->dataLength-UTRIE2_DATA_GRANULARITY];
        }
        value=enumValue(context, highValue);
        if(value!=prevValue) {
            if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                return;
            }
            prev=c;
            prevValue=value;
        }
        c=limit;
    }

    /* deliver last range */
    enumRange(context, prev, c-1, prevValue);
}